

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypt.cpp
# Opt level: O1

RPCHelpMan * wallet::walletpassphrase(void)

{
  ulong *puVar1;
  long *plVar2;
  string name;
  string name_00;
  string m_key_name;
  RPCResult result;
  string description;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_00;
  string description_01;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  undefined1 auVar3 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined8 uVar8;
  RPCHelpMan *in_RDI;
  long lVar9;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  undefined8 in_stack_fffffffffffff878;
  undefined8 in_stack_fffffffffffff888;
  undefined8 in_stack_fffffffffffff890;
  undefined8 in_stack_fffffffffffff898;
  code *pcVar10;
  undefined8 in_stack_fffffffffffff8a0;
  pointer in_stack_fffffffffffff8a8;
  pointer pRVar11;
  pointer in_stack_fffffffffffff8b0;
  pointer pRVar12;
  pointer in_stack_fffffffffffff8b8;
  pointer pRVar13;
  undefined1 in_stack_fffffffffffff8c0 [16];
  _Vector_impl_data in_stack_fffffffffffff8d0;
  undefined1 in_stack_fffffffffffff8e8 [16];
  pointer in_stack_fffffffffffff8f8;
  _Alloc_hider in_stack_fffffffffffff900;
  _Alloc_hider _Var14;
  size_type in_stack_fffffffffffff908;
  undefined8 in_stack_fffffffffffff910;
  undefined8 in_stack_fffffffffffff918;
  _Alloc_hider in_stack_fffffffffffff920;
  _Alloc_hider _Var15;
  size_type in_stack_fffffffffffff928;
  undefined8 in_stack_fffffffffffff930;
  undefined8 in_stack_fffffffffffff938;
  _Alloc_hider in_stack_fffffffffffff940;
  size_type in_stack_fffffffffffff948;
  undefined8 in_stack_fffffffffffff950;
  undefined8 in_stack_fffffffffffff958;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  ulong *local_560;
  undefined8 local_558;
  ulong local_550;
  undefined8 uStack_548;
  ulong *local_540;
  size_type local_538;
  ulong local_530;
  undefined8 uStack_528;
  long *local_520 [2];
  long local_510 [2];
  long *local_500 [2];
  long local_4f0 [2];
  RPCResult local_4e0;
  undefined1 local_458;
  undefined1 *local_450;
  undefined8 local_448;
  undefined1 local_440;
  undefined7 uStack_43f;
  undefined1 local_430 [32];
  long *local_410 [2];
  long local_400 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_3f0;
  undefined1 local_398;
  long *local_390 [2];
  long local_380 [2];
  undefined1 local_370;
  vector<RPCArg,_std::allocator<RPCArg>_> local_368;
  undefined1 auStack_350 [8];
  undefined1 local_348 [32];
  long *local_328 [2];
  long local_318 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_308;
  undefined1 local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"walletpassphrase","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nStores the wallet decryption key in memory for \'timeout\' seconds.\nThis is needed prior to performing transactions related to private keys such as sending bitcoins\n\nNote:\nIssuing the walletpassphrase command while the wallet is already unlocked will set a new unlock\ntime that overrides the old one.\n"
             ,"");
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_2a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"passphrase","");
  local_308._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_2b0 = 0;
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"The wallet passphrase","");
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_370 = 0;
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_348._0_8_ = (pointer)0x0;
  local_348._8_2_ = 0;
  local_348._10_6_ = 0;
  local_348._16_2_ = 0;
  local_348._18_8_ = 0;
  name._M_string_length = (size_type)in_RDI;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff878;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff888;
  name.field_2._8_8_ = in_stack_fffffffffffff890;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff8a0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff898;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_fffffffffffff8a8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_fffffffffffff8b0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff8b8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_16_ = in_stack_fffffffffffff8c0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff8d0._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff8d0._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff8d0._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff8e8;
  description_00._M_string_length = (size_type)in_stack_fffffffffffff900._M_p;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8f8;
  description_00.field_2._M_allocated_capacity = in_stack_fffffffffffff908;
  description_00.field_2._8_8_ = in_stack_fffffffffffff910;
  opts.oneline_description._M_dataplus._M_p = in_stack_fffffffffffff920._M_p;
  opts._0_8_ = in_stack_fffffffffffff918;
  opts.oneline_description._M_string_length = in_stack_fffffffffffff928;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff930;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff938;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff940._M_p;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff948;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff950;
  opts.hidden = (bool)(char)in_stack_fffffffffffff958;
  opts.also_positional = (bool)(char)((ulong)in_stack_fffffffffffff958 >> 8);
  opts._66_6_ = (int6)((ulong)in_stack_fffffffffffff958 >> 0x10);
  ::RPCArg::RPCArg(&local_288,name,(Type)&local_2a8,fallback,description_00,opts);
  local_390[0] = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"timeout","");
  local_3f0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_398 = 0;
  local_410[0] = local_400;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_410,
             "The time to keep the decryption key in seconds; capped at 100000000 (~3 years).","");
  local_450 = &local_440;
  local_458 = 0;
  local_448 = 0;
  local_440 = 0;
  local_430._0_8_ = (pointer)0x0;
  local_430._8_2_ = 0;
  local_430._10_6_ = 0;
  local_430._16_2_ = 0;
  local_430._18_8_ = 0;
  name_00._M_string_length = (size_type)in_RDI;
  name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff878;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff888;
  name_00.field_2._8_8_ = in_stack_fffffffffffff890;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff8a0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff898;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_fffffffffffff8a8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_fffffffffffff8b0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff8b8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_16_ = in_stack_fffffffffffff8c0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff8d0._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff8d0._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff8d0._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff8e8;
  description_01._M_string_length = (size_type)in_stack_fffffffffffff900._M_p;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8f8;
  description_01.field_2._M_allocated_capacity = in_stack_fffffffffffff908;
  description_01.field_2._8_8_ = in_stack_fffffffffffff910;
  opts_00.oneline_description._M_dataplus._M_p = in_stack_fffffffffffff920._M_p;
  opts_00._0_8_ = in_stack_fffffffffffff918;
  opts_00.oneline_description._M_string_length = in_stack_fffffffffffff928;
  opts_00.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff930;
  opts_00.oneline_description.field_2._8_8_ = in_stack_fffffffffffff938;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff940._M_p;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff948;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff950;
  opts_00.hidden = (bool)(char)in_stack_fffffffffffff958;
  opts_00.also_positional = (bool)(char)((ulong)in_stack_fffffffffffff958 >> 8);
  opts_00._66_6_ = (int6)((ulong)in_stack_fffffffffffff958 >> 0x10);
  ::RPCArg::RPCArg(&local_180,name_00,(Type)local_390,fallback_00,description_01,opts_00);
  __l._M_len = 2;
  __l._M_array = &local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff8e8,__l,
             (allocator_type *)&stack0xfffffffffffff8e7);
  local_500[0] = local_4f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"");
  local_520[0] = local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"");
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff878;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff888;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff890;
  auVar3._16_8_ = 0;
  auVar3._0_16_ = in_stack_fffffffffffff8c0;
  ::RPCResult::RPCResult
            (&local_4e0,NONE,m_key_name,
             (string)ZEXT1632(CONCAT88(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898)),
             (vector<RPCResult,_std::allocator<RPCResult>_>)(auVar3 << 0x40),false);
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffff878;
  result.m_key_name._M_string_length = in_stack_fffffffffffff888;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff890;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff898;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff8a0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar11;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar12;
  result._64_8_ = pRVar13;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8c0._0_8_;
  result.m_description._M_string_length = in_stack_fffffffffffff8c0._8_8_;
  result._88_24_ = in_stack_fffffffffffff8d0;
  result.m_cond._8_16_ = in_stack_fffffffffffff8e8;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffff8f8;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff8c8,result);
  local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"walletpassphrase","");
  local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"\"my pass phrase\" 60","");
  HelpExampleCli(&local_600,&local_620,&local_640);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_600,0,0,"\nUnlock the wallet for 60 seconds\n",0x22);
  local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if (paVar7 == paVar6) {
    local_5e0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_5e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_5e0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_5e0._M_dataplus._M_p = (pointer)paVar7;
  }
  local_5e0._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_5e0,"\nLock the wallet again (before 60 seconds)\n");
  local_5c0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p == paVar7) {
    local_5c0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_5c0.field_2._8_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 8);
    local_5c0.field_2._12_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 0xc);
    local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  }
  else {
    local_5c0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_5c0._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_680,"walletlock","");
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"");
  HelpExampleCli(&local_660,&local_680,&local_6a0);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    uVar8 = local_5c0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_660._M_string_length + local_5c0._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_660._M_dataplus._M_p != &local_660.field_2) {
      uVar8 = local_660.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_660._M_string_length + local_5c0._M_string_length) goto LAB_005f8504;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_660,0,0,local_5c0._M_dataplus._M_p,local_5c0._M_string_length);
  }
  else {
LAB_005f8504:
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_5c0,local_660._M_dataplus._M_p,local_660._M_string_length);
  }
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if (paVar6 == paVar7) {
    local_5a0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_5a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_5a0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_5a0._M_dataplus._M_p = (pointer)paVar6;
  }
  local_5a0._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_5a0,"\nAs a JSON-RPC call\n");
  paVar7 = &local_580.field_2;
  local_580._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p == paVar6) {
    local_580.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_580.field_2._8_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 8);
    local_580.field_2._12_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 0xc);
    local_580._M_dataplus._M_p = (pointer)paVar7;
  }
  else {
    local_580.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_580._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  _Var15._M_p = &stack0xfffffffffffff930;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff920,"walletpassphrase","");
  _Var14._M_p = &stack0xfffffffffffff910;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff900,"\"my pass phrase\", 60","");
  HelpExampleRpc((string *)&stack0xfffffffffffff940,(string *)&stack0xfffffffffffff920,
                 (string *)&stack0xfffffffffffff900);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != paVar7) {
    uVar8 = local_580.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < in_stack_fffffffffffff948 + local_580._M_string_length) {
    uVar8 = 0xf;
    if (in_stack_fffffffffffff940._M_p != &stack0xfffffffffffff950) {
      uVar8 = in_stack_fffffffffffff950;
    }
    if (in_stack_fffffffffffff948 + local_580._M_string_length <= (ulong)uVar8) {
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffff940,0,0,local_580._M_dataplus._M_p,
                       local_580._M_string_length);
      goto LAB_005f86cd;
    }
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_580,in_stack_fffffffffffff940._M_p,in_stack_fffffffffffff948);
LAB_005f86cd:
  local_560 = &local_550;
  puVar1 = (ulong *)(pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1 == paVar6) {
    local_550 = paVar6->_M_allocated_capacity;
    uStack_548 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_550 = paVar6->_M_allocated_capacity;
    local_560 = puVar1;
  }
  local_538 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  paVar6->_M_local_buf[0] = '\0';
  if (local_560 == &local_550) {
    uStack_528 = uStack_548;
    local_540 = &local_530;
  }
  else {
    local_540 = local_560;
  }
  local_530 = local_550;
  local_558 = 0;
  local_550 = local_550 & 0xffffffffffffff00;
  pcVar10 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/encrypt.cpp:32:9)>
            ::_M_manager;
  description._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/encrypt.cpp:32:9)>
       ::_M_invoke;
  description._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/encrypt.cpp:32:9)>
                ::_M_manager;
  description.field_2._M_allocated_capacity = (size_type)pRVar11;
  description.field_2._8_8_ = pRVar12;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_fffffffffffff8c0._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffff8c0._8_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = pRVar13;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff8f8;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8e8._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff8e8._8_8_;
  examples.m_examples.field_2._8_8_ = _Var14._M_p;
  local_560 = &local_550;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff888)),description,args,
             (RPCResults)in_stack_fffffffffffff8d0,examples,(RPCMethodImpl *)&local_58);
  if (pcVar10 != (code *)0x0) {
    (*pcVar10)(&stack0xfffffffffffff888,&stack0xfffffffffffff888,3);
  }
  if (local_540 != &local_530) {
    operator_delete(local_540,local_530 + 1);
  }
  if (local_560 != &local_550) {
    operator_delete(local_560,local_550 + 1);
  }
  if (in_stack_fffffffffffff940._M_p != &stack0xfffffffffffff950) {
    operator_delete(in_stack_fffffffffffff940._M_p,in_stack_fffffffffffff950 + 1);
  }
  if (_Var14._M_p != &stack0xfffffffffffff910) {
    operator_delete(_Var14._M_p,in_stack_fffffffffffff910 + 1);
  }
  if (_Var15._M_p != &stack0xfffffffffffff930) {
    operator_delete(_Var15._M_p,in_stack_fffffffffffff930 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != paVar7) {
    operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_680._M_dataplus._M_p != &local_680.field_2) {
    operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_600._M_dataplus._M_p != &local_600.field_2) {
    operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != &local_640.field_2) {
    operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620._M_dataplus._M_p != &local_620.field_2) {
    operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.m_cond._M_dataplus._M_p != &local_4e0.m_cond.field_2) {
    operator_delete(local_4e0.m_cond._M_dataplus._M_p,
                    local_4e0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.m_description._M_dataplus._M_p != &local_4e0.m_description.field_2) {
    operator_delete(local_4e0.m_description._M_dataplus._M_p,
                    local_4e0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_4e0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.m_key_name._M_dataplus._M_p != &local_4e0.m_key_name.field_2) {
    operator_delete(local_4e0.m_key_name._M_dataplus._M_p,
                    local_4e0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8a8);
  if (local_520[0] != local_510) {
    operator_delete(local_520[0],local_510[0] + 1);
  }
  if (local_500[0] != local_4f0) {
    operator_delete(local_500[0],local_4f0[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff8e8);
  lVar9 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_2a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar9));
    plVar2 = *(long **)((long)&local_308 + lVar9 + 0x40);
    plVar5 = (long *)((long)&local_308 + lVar9 + 0x50);
    if (plVar5 != plVar2) {
      operator_delete(plVar2,*plVar5 + 1);
    }
    plVar5 = (long *)((long)&local_308 + lVar9 + 0x28);
    plVar2 = *(long **)((long)&local_308 + lVar9 + 0x18);
    if (plVar5 != plVar2) {
      operator_delete(plVar2,*plVar5 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_350 + lVar9));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + lVar9
               ));
    if ((long *)((long)local_380 + lVar9) != *(long **)((long)local_390 + lVar9)) {
      operator_delete(*(long **)((long)local_390 + lVar9),*(long *)((long)local_380 + lVar9) + 1);
    }
    lVar9 = lVar9 + -0x108;
  } while (lVar9 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_430);
  if (local_450 != &local_440) {
    operator_delete(local_450,CONCAT71(uStack_43f,local_440) + 1);
  }
  if (local_410[0] != local_400) {
    operator_delete(local_410[0],local_400[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_3f0._M_first);
  if (local_390[0] != local_380) {
    operator_delete(local_390[0],local_380[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_348);
  if (local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_328[0] != local_318) {
    operator_delete(local_328[0],local_318[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_308._M_first);
  if (local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_2a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_2a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_2a8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan walletpassphrase()
{
    return RPCHelpMan{"walletpassphrase",
                "\nStores the wallet decryption key in memory for 'timeout' seconds.\n"
                "This is needed prior to performing transactions related to private keys such as sending bitcoins\n"
            "\nNote:\n"
            "Issuing the walletpassphrase command while the wallet is already unlocked will set a new unlock\n"
            "time that overrides the old one.\n",
                {
                    {"passphrase", RPCArg::Type::STR, RPCArg::Optional::NO, "The wallet passphrase"},
                    {"timeout", RPCArg::Type::NUM, RPCArg::Optional::NO, "The time to keep the decryption key in seconds; capped at 100000000 (~3 years)."},
                },
                RPCResult{RPCResult::Type::NONE, "", ""},
                RPCExamples{
            "\nUnlock the wallet for 60 seconds\n"
            + HelpExampleCli("walletpassphrase", "\"my pass phrase\" 60") +
            "\nLock the wallet again (before 60 seconds)\n"
            + HelpExampleCli("walletlock", "") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("walletpassphrase", "\"my pass phrase\", 60")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const wallet = GetWalletForJSONRPCRequest(request);
    if (!wallet) return UniValue::VNULL;
    CWallet* const pwallet = wallet.get();

    int64_t nSleepTime;
    int64_t relock_time;
    // Prevent concurrent calls to walletpassphrase with the same wallet.
    LOCK(pwallet->m_unlock_mutex);
    {
        LOCK(pwallet->cs_wallet);

        if (!pwallet->IsCrypted()) {
            throw JSONRPCError(RPC_WALLET_WRONG_ENC_STATE, "Error: running with an unencrypted wallet, but walletpassphrase was called.");
        }

        // Note that the walletpassphrase is stored in request.params[0] which is not mlock()ed
        SecureString strWalletPass;
        strWalletPass.reserve(100);
        strWalletPass = std::string_view{request.params[0].get_str()};

        // Get the timeout
        nSleepTime = request.params[1].getInt<int64_t>();
        // Timeout cannot be negative, otherwise it will relock immediately
        if (nSleepTime < 0) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Timeout cannot be negative.");
        }
        // Clamp timeout
        constexpr int64_t MAX_SLEEP_TIME = 100000000; // larger values trigger a macos/libevent bug?
        if (nSleepTime > MAX_SLEEP_TIME) {
            nSleepTime = MAX_SLEEP_TIME;
        }

        if (strWalletPass.empty()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "passphrase cannot be empty");
        }

        if (!pwallet->Unlock(strWalletPass)) {
            // Check if the passphrase has a null character (see #27067 for details)
            if (strWalletPass.find('\0') == std::string::npos) {
                throw JSONRPCError(RPC_WALLET_PASSPHRASE_INCORRECT, "Error: The wallet passphrase entered was incorrect.");
            } else {
                throw JSONRPCError(RPC_WALLET_PASSPHRASE_INCORRECT, "Error: The wallet passphrase entered is incorrect. "
                                                                    "It contains a null character (ie - a zero byte). "
                                                                    "If the passphrase was set with a version of this software prior to 25.0, "
                                                                    "please try again with only the characters up to — but not including — "
                                                                    "the first null character. If this is successful, please set a new "
                                                                    "passphrase to avoid this issue in the future.");
            }
        }

        pwallet->TopUpKeyPool();

        pwallet->nRelockTime = GetTime() + nSleepTime;
        relock_time = pwallet->nRelockTime;
    }

    // rpcRunLater must be called without cs_wallet held otherwise a deadlock
    // can occur. The deadlock would happen when RPCRunLater removes the
    // previous timer (and waits for the callback to finish if already running)
    // and the callback locks cs_wallet.
    AssertLockNotHeld(wallet->cs_wallet);
    // Keep a weak pointer to the wallet so that it is possible to unload the
    // wallet before the following callback is called. If a valid shared pointer
    // is acquired in the callback then the wallet is still loaded.
    std::weak_ptr<CWallet> weak_wallet = wallet;
    pwallet->chain().rpcRunLater(strprintf("lockwallet(%s)", pwallet->GetName()), [weak_wallet, relock_time] {
        if (auto shared_wallet = weak_wallet.lock()) {
            LOCK2(shared_wallet->m_relock_mutex, shared_wallet->cs_wallet);
            // Skip if this is not the most recent rpcRunLater callback.
            if (shared_wallet->nRelockTime != relock_time) return;
            shared_wallet->Lock();
            shared_wallet->nRelockTime = 0;
        }
    }, nSleepTime);

    return UniValue::VNULL;
},
    };
}